

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdNode.cpp
# Opt level: O1

KdNode * KdNode::build(vector<Triangle,_std::allocator<Triangle>_> *triangles,
                      vector<float,_std::allocator<float>_> *ranges,int depth)

{
  float *pfVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  float fVar5;
  pointer pTVar6;
  pointer pfVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  KdNode *pKVar18;
  long lVar19;
  KdNode *pKVar20;
  float *pfVar21;
  float *pfVar22;
  iterator __begin1;
  pointer __args;
  int iVar23;
  undefined1 auStack_88 [8];
  vector<Triangle,_std::allocator<Triangle>_> rightTrs;
  undefined1 auStack_68 [8];
  vector<Triangle,_std::allocator<Triangle>_> leftTrs;
  iterator __end1;
  
  __args = (triangles->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar6 = (triangles->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pTVar6 == __args) {
    pKVar18 = (KdNode *)0x0;
  }
  else {
    pKVar18 = (KdNode *)operator_new(0x30);
    *(undefined8 *)pKVar18 = 0;
    pKVar18->left = (KdNode *)0x0;
    pKVar18->right = (KdNode *)0x0;
    (pKVar18->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pKVar18->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pKVar18->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (depth < 0x15 && 0x27f < (ulong)((long)pTVar6 - (long)__args)) {
      auStack_68 = (undefined1  [8])0x0;
      leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      auStack_88 = (undefined1  [8])0x0;
      rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      iVar23 = depth % 3;
      iVar2 = iVar23 * 2;
      pfVar7 = (ranges->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar3 = iVar23 * 2 + 1;
      __end1._M_current._0_4_ = (pfVar7[iVar2] + pfVar7[iVar3]) * 0.5;
      if (__args != pTVar6) {
        pfVar1 = (float *)((long)&__end1._M_current + 4);
        do {
          pfVar22 = pfVar1;
          if (iVar23 == 2) {
            __end1._M_current._4_4_ = (__args->x).z;
            lVar19 = 4;
            pfVar21 = pfVar1;
            do {
              pfVar4 = (float *)((long)&__end1._M_current + lVar19 + 4);
              if (*pfVar4 <= *pfVar21 && *pfVar21 != *pfVar4) {
                pfVar21 = (float *)((long)&__end1._M_current + lVar19 + 4);
              }
              lVar19 = lVar19 + 4;
            } while (lVar19 != 0xc);
            if (*pfVar21 <= __end1._M_current._0_4_) {
              if (leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<Triangle,std::allocator<Triangle>>::_M_realloc_insert<Triangle_const&>
                          ((vector<Triangle,std::allocator<Triangle>> *)auStack_68,
                           (iterator)
                           leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                           super__Vector_impl_data._M_start,__args);
              }
              else {
                fVar16 = (__args->x).x;
                fVar17 = (__args->x).y;
                uVar8 = *(undefined8 *)&(__args->x).z;
                fVar12 = (__args->y).y;
                fVar13 = (__args->y).z;
                fVar14 = (__args->z).x;
                fVar15 = (__args->z).y;
                uVar9 = *(undefined8 *)&(__args->z).z;
                uVar10 = *(undefined8 *)&(__args->colorY).g;
                fVar5 = (__args->normal).y;
                uVar11 = *(undefined8 *)&(__args->normal).z;
                ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->normal).x = (__args->normal).x;
                ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->normal).y = fVar5;
                *(undefined8 *)
                 &((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                    super__Vector_impl_data._M_start)->normal).z = uVar11;
                *(undefined8 *)
                 &((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                    super__Vector_impl_data._M_start)->z).z = uVar9;
                *(undefined8 *)
                 &((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                    super__Vector_impl_data._M_start)->colorY).g = uVar10;
                ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->y).y = fVar12;
                ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->y).z = fVar13;
                ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->z).x = fVar14;
                ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->z).y = fVar15;
                ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->x).x = fVar16;
                ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->x).y = fVar17;
                *(undefined8 *)
                 &((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                    super__Vector_impl_data._M_start)->x).z = uVar8;
                leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                super__Vector_impl_data._M_start =
                     leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                     super__Vector_impl_data._M_start + 1;
              }
            }
            __end1._M_current._4_4_ = (__args->x).z;
            lVar19 = 4;
            do {
              fVar5 = *(float *)((long)&__end1._M_current + lVar19 + 4);
              if (*pfVar22 <= fVar5 && fVar5 != *pfVar22) {
                pfVar22 = (float *)((long)&__end1._M_current + lVar19 + 4);
              }
              lVar19 = lVar19 + 4;
            } while (lVar19 != 0xc);
LAB_00104a84:
            if (__end1._M_current._0_4_ < *pfVar22) {
              if (rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<Triangle,std::allocator<Triangle>>::_M_realloc_insert<Triangle_const&>
                          ((vector<Triangle,std::allocator<Triangle>> *)auStack_88,
                           (iterator)
                           rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                           super__Vector_impl_data._M_start,__args);
              }
              else {
                fVar16 = (__args->x).x;
                fVar17 = (__args->x).y;
                uVar8 = *(undefined8 *)&(__args->x).z;
                fVar12 = (__args->y).y;
                fVar13 = (__args->y).z;
                fVar14 = (__args->z).x;
                fVar15 = (__args->z).y;
                uVar9 = *(undefined8 *)&(__args->z).z;
                uVar10 = *(undefined8 *)&(__args->colorY).g;
                fVar5 = (__args->normal).y;
                uVar11 = *(undefined8 *)&(__args->normal).z;
                ((rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->normal).x = (__args->normal).x;
                ((rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->normal).y = fVar5;
                *(undefined8 *)
                 &((rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                    super__Vector_impl_data._M_start)->normal).z = uVar11;
                *(undefined8 *)
                 &((rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                    super__Vector_impl_data._M_start)->z).z = uVar9;
                *(undefined8 *)
                 &((rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                    super__Vector_impl_data._M_start)->colorY).g = uVar10;
                ((rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->y).y = fVar12;
                ((rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->y).z = fVar13;
                ((rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->z).x = fVar14;
                ((rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->z).y = fVar15;
                ((rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->x).x = fVar16;
                ((rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->x).y = fVar17;
                *(undefined8 *)
                 &((rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                    super__Vector_impl_data._M_start)->x).z = uVar8;
                rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                super__Vector_impl_data._M_start =
                     rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                     super__Vector_impl_data._M_start + 1;
              }
            }
          }
          else {
            if (iVar23 == 1) {
              __end1._M_current._4_4_ = (__args->x).y;
              lVar19 = 4;
              pfVar21 = pfVar1;
              do {
                pfVar4 = (float *)((long)&__end1._M_current + lVar19 + 4);
                if (*pfVar4 <= *pfVar21 && *pfVar21 != *pfVar4) {
                  pfVar21 = (float *)((long)&__end1._M_current + lVar19 + 4);
                }
                lVar19 = lVar19 + 4;
              } while (lVar19 != 0xc);
              if (*pfVar21 <= __end1._M_current._0_4_) {
                if (leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                    super__Vector_impl_data._M_start ==
                    leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  std::vector<Triangle,std::allocator<Triangle>>::_M_realloc_insert<Triangle_const&>
                            ((vector<Triangle,std::allocator<Triangle>> *)auStack_68,
                             (iterator)
                             leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl
                             .super__Vector_impl_data._M_start,__args);
                }
                else {
                  fVar16 = (__args->x).x;
                  fVar17 = (__args->x).y;
                  uVar8 = *(undefined8 *)&(__args->x).z;
                  fVar12 = (__args->y).y;
                  fVar13 = (__args->y).z;
                  fVar14 = (__args->z).x;
                  fVar15 = (__args->z).y;
                  uVar9 = *(undefined8 *)&(__args->z).z;
                  uVar10 = *(undefined8 *)&(__args->colorY).g;
                  fVar5 = (__args->normal).y;
                  uVar11 = *(undefined8 *)&(__args->normal).z;
                  ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                    super__Vector_impl_data._M_start)->normal).x = (__args->normal).x;
                  ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                    super__Vector_impl_data._M_start)->normal).y = fVar5;
                  *(undefined8 *)
                   &((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                      super__Vector_impl_data._M_start)->normal).z = uVar11;
                  *(undefined8 *)
                   &((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                      super__Vector_impl_data._M_start)->z).z = uVar9;
                  *(undefined8 *)
                   &((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                      super__Vector_impl_data._M_start)->colorY).g = uVar10;
                  ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                    super__Vector_impl_data._M_start)->y).y = fVar12;
                  ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                    super__Vector_impl_data._M_start)->y).z = fVar13;
                  ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                    super__Vector_impl_data._M_start)->z).x = fVar14;
                  ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                    super__Vector_impl_data._M_start)->z).y = fVar15;
                  ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                    super__Vector_impl_data._M_start)->x).x = fVar16;
                  ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                    super__Vector_impl_data._M_start)->x).y = fVar17;
                  *(undefined8 *)
                   &((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                      super__Vector_impl_data._M_start)->x).z = uVar8;
                  leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                       super__Vector_impl_data._M_start + 1;
                }
              }
              __end1._M_current._4_4_ = (__args->x).y;
              lVar19 = 4;
              do {
                fVar5 = *(float *)((long)&__end1._M_current + lVar19 + 4);
                if (*pfVar22 <= fVar5 && fVar5 != *pfVar22) {
                  pfVar22 = (float *)((long)&__end1._M_current + lVar19 + 4);
                }
                lVar19 = lVar19 + 4;
              } while (lVar19 != 0xc);
              goto LAB_00104a84;
            }
            if (iVar23 == 0) {
              __end1._M_current._4_4_ = (__args->x).x;
              lVar19 = 4;
              pfVar21 = pfVar1;
              do {
                pfVar4 = (float *)((long)&__end1._M_current + lVar19 + 4);
                if (*pfVar4 <= *pfVar21 && *pfVar21 != *pfVar4) {
                  pfVar21 = (float *)((long)&__end1._M_current + lVar19 + 4);
                }
                lVar19 = lVar19 + 4;
              } while (lVar19 != 0xc);
              if (*pfVar21 <= __end1._M_current._0_4_) {
                if (leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                    super__Vector_impl_data._M_start ==
                    leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  std::vector<Triangle,std::allocator<Triangle>>::_M_realloc_insert<Triangle_const&>
                            ((vector<Triangle,std::allocator<Triangle>> *)auStack_68,
                             (iterator)
                             leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl
                             .super__Vector_impl_data._M_start,__args);
                }
                else {
                  fVar16 = (__args->x).x;
                  fVar17 = (__args->x).y;
                  uVar8 = *(undefined8 *)&(__args->x).z;
                  fVar12 = (__args->y).y;
                  fVar13 = (__args->y).z;
                  fVar14 = (__args->z).x;
                  fVar15 = (__args->z).y;
                  uVar9 = *(undefined8 *)&(__args->z).z;
                  uVar10 = *(undefined8 *)&(__args->colorY).g;
                  fVar5 = (__args->normal).y;
                  uVar11 = *(undefined8 *)&(__args->normal).z;
                  ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                    super__Vector_impl_data._M_start)->normal).x = (__args->normal).x;
                  ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                    super__Vector_impl_data._M_start)->normal).y = fVar5;
                  *(undefined8 *)
                   &((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                      super__Vector_impl_data._M_start)->normal).z = uVar11;
                  *(undefined8 *)
                   &((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                      super__Vector_impl_data._M_start)->z).z = uVar9;
                  *(undefined8 *)
                   &((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                      super__Vector_impl_data._M_start)->colorY).g = uVar10;
                  ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                    super__Vector_impl_data._M_start)->y).y = fVar12;
                  ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                    super__Vector_impl_data._M_start)->y).z = fVar13;
                  ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                    super__Vector_impl_data._M_start)->z).x = fVar14;
                  ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                    super__Vector_impl_data._M_start)->z).y = fVar15;
                  ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                    super__Vector_impl_data._M_start)->x).x = fVar16;
                  ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                    super__Vector_impl_data._M_start)->x).y = fVar17;
                  *(undefined8 *)
                   &((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                      super__Vector_impl_data._M_start)->x).z = uVar8;
                  leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                       super__Vector_impl_data._M_start + 1;
                }
              }
              __end1._M_current._4_4_ = (__args->x).x;
              lVar19 = 4;
              do {
                fVar5 = *(float *)((long)&__end1._M_current + lVar19 + 4);
                if (*pfVar22 <= fVar5 && fVar5 != *pfVar22) {
                  pfVar22 = (float *)((long)&__end1._M_current + lVar19 + 4);
                }
                lVar19 = lVar19 + 4;
              } while (lVar19 != 0xc);
              goto LAB_00104a84;
            }
          }
          __args = __args + 1;
        } while (__args != pTVar6);
      }
      pKVar18->plane = __end1._M_current._0_4_;
      pfVar7 = (ranges->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      fVar5 = pfVar7[iVar2];
      pfVar7[iVar2] = __end1._M_current._0_4_;
      pKVar20 = build((vector<Triangle,_std::allocator<Triangle>_> *)auStack_88,ranges,depth + 1);
      pKVar18->right = pKVar20;
      pfVar7 = (ranges->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pfVar7[iVar2] = fVar5;
      fVar5 = pfVar7[iVar3];
      pfVar7[iVar3] = __end1._M_current._0_4_;
      pKVar20 = build((vector<Triangle,_std::allocator<Triangle>_> *)auStack_68,ranges,depth + 1);
      pKVar18->left = pKVar20;
      (ranges->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start[iVar3] = fVar5;
      if (auStack_88 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_88,
                        (long)rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)auStack_88);
      }
      if (auStack_68 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_68,
                        (long)leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)auStack_68);
      }
    }
    else {
      std::vector<Triangle,_std::allocator<Triangle>_>::operator=(&pKVar18->triangles,triangles);
    }
  }
  return pKVar18;
}

Assistant:

KdNode* KdNode::build(std::vector<Triangle>& triangles, std::vector<float> &ranges, int depth)
{
  if (triangles.size() == 0)
    return nullptr;

  KdNode* node = new KdNode();

  if (triangles.size() < 10 || depth > 20)
  {
    node->triangles = triangles;
    return node;
  }

  std::vector<Triangle> leftTrs;
  std::vector<Triangle> rightTrs;

  int axis = depth % 3;

  float midValue = (ranges[axis*2] + ranges[axis*2+1]) / 2;
  for (auto const& triangle : triangles)
  {
    switch (axis)
    {
      case 0:
        if(getMinPoint(triangle).x <= midValue)
            leftTrs.push_back(triangle);
        if(getMaxPoint(triangle).x > midValue)
            rightTrs.push_back(triangle);
        break;
      case 1:
        if(getMinPoint(triangle).y <= midValue)
            leftTrs.push_back(triangle);
        if(getMaxPoint(triangle).y > midValue)
            rightTrs.push_back(triangle);
        break;
      case 2:
        if(getMinPoint(triangle).z <= midValue)
            leftTrs.push_back(triangle);
        if(getMaxPoint(triangle).z > midValue)
            rightTrs.push_back(triangle);
        break;
    }
  }

  node->plane = midValue;

  float tmp = ranges[axis*2];
  ranges[axis*2] = midValue;
  node->right = KdNode::build(rightTrs, ranges, depth+1);
  ranges[axis*2] = tmp;
  tmp = ranges[axis*2+1];
  ranges[axis*2+1] = midValue;
  node->left = KdNode::build(leftTrs, ranges, depth+1);
  ranges[axis*2+1] = tmp;

  return node;
}